

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

uchar med3char<unsigned_char>(uchar a,uchar b,uchar c)

{
  uchar local_9;
  uchar c_local;
  uchar b_local;
  uchar a_local;
  
  local_9 = a;
  if (((a != b) && (local_9 = c, c != a)) && (c != b)) {
    local_9 = b;
    if (a < b) {
      if ((c <= b) && (local_9 = a, a < c)) {
        local_9 = c;
      }
    }
    else if ((b <= c) && (local_9 = c, a < c)) {
      local_9 = a;
    }
  }
  return local_9;
}

Assistant:

CharT
med3char(CharT a, CharT b, CharT c)
{
	if (a == b)           return a;
	if (c == a || c == b) return c;
	if (a < b) {
		if (b < c) return b;
		if (a < c) return c;
		return a;
	}
	if (b > c) return b;
	if (a < c) return a;
	return c;
}